

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O0

bool __thiscall LTFlightData::TryGetSafeCopy(LTFlightData *this,FDDynamicData *outDyn)

{
  bool bVar1;
  const_reference __src;
  void *in_RSI;
  long in_RDI;
  system_error *e;
  unique_lock<std::recursive_mutex> lock;
  FDDynamicData *in_stack_ffffffffffffff40;
  deque<LTFlightData::FDDynamicData,_std::allocator<LTFlightData::FDDynamicData>_>
  *in_stack_ffffffffffffff50;
  undefined1 local_88 [96];
  unique_lock<std::recursive_mutex> local_28;
  void *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  std::unique_lock<std::recursive_mutex>::unique_lock(&local_28,in_RDI + 0x378);
  bVar1 = std::unique_lock::operator_cast_to_bool((unique_lock<std::recursive_mutex> *)0x1de597);
  if (bVar1) {
    bVar1 = std::deque<LTFlightData::FDDynamicData,_std::allocator<LTFlightData::FDDynamicData>_>::
            empty((deque<LTFlightData::FDDynamicData,_std::allocator<LTFlightData::FDDynamicData>_>
                   *)0x1de5b1);
    if (bVar1) {
      FDDynamicData::FDDynamicData(in_stack_ffffffffffffff40);
    }
    else {
      __src = std::deque<LTFlightData::FDDynamicData,_std::allocator<LTFlightData::FDDynamicData>_>
              ::front(in_stack_ffffffffffffff50);
      memcpy(local_88,__src,0x48);
    }
    memcpy(local_18,local_88,0x48);
    local_1 = 1;
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)in_stack_ffffffffffffff40);
  if (!bVar1) {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool LTFlightData::TryGetSafeCopy ( FDDynamicData& outDyn ) const
{
    try {
        std::unique_lock<std::recursive_mutex> lock (dataAccessMutex, std::try_to_lock );
        if ( lock )
        {
            // we got the lock, return a copy of the data
            outDyn = dynDataDeque.empty() ? FDDynamicData() : dynDataDeque.front();
            // Success!
            return true;
        }
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    }
    
    // Either didn't get the lock or some caught error
    return false;
}